

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ConfigDeclarationSyntax * __thiscall
slang::parsing::Parser::parseConfigDeclaration(Parser *this,AttrList attributes)

{
  SyntaxKind SVar1;
  Token semi;
  Token semi_00;
  Token cell;
  Token dot_00;
  span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL> elements;
  Token topModule_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL> elements_01;
  span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL> elements_02;
  span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL> elements_03;
  Token defaultKeyword;
  Token instance;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  Token semi_01;
  Token name_00;
  Token semi_02;
  Token semi1_00;
  Token design_00;
  Token semi2_00;
  Token endconfig_00;
  bool bVar2;
  int iVar4;
  ParameterDeclarationSyntax *pPVar5;
  ExpressionSyntax *pEVar6;
  SyntaxNode *this_00;
  ParenthesizedExpressionSyntax *pPVar7;
  bool bVar3;
  reference ppCVar8;
  NamedBlockClauseSyntax *pNVar9;
  undefined4 extraout_var;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *localparams_00;
  undefined4 extraout_var_01;
  ConfigDeclarationSyntax *pCVar11;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  Parser *extraout_RDX_01;
  EVP_PKEY_CTX *src_00;
  undefined8 extraout_RDX_02;
  EVP_PKEY_CTX *src_01;
  Info *extraout_RDX_03;
  EVP_PKEY_CTX *src_02;
  undefined8 *in_RDI;
  iterator iVar12;
  Token TVar13;
  SourceRange SVar14;
  string_view sVar15;
  SourceRange SVar16;
  Token TVar17;
  Token config_00;
  Token TVar18;
  NamedBlockClauseSyntax *blockName;
  Token endconfig;
  ConfigRuleClauseSyntax *rule_1;
  Token dot;
  SmallVector<slang::syntax::ConfigInstanceIdentifierSyntax_*,_5UL> instanceNames;
  Token topModule;
  ConfigRuleClauseSyntax *rule;
  ConfigCellIdentifierSyntax *cellName;
  ConfigLiblistSyntax *liblist;
  Diagnostic *diag;
  Token token;
  SmallVector<slang::syntax::ConfigRuleSyntax_*,_5UL> rules;
  ConfigRuleSyntax *defaultRule;
  Token semi2;
  SmallVector<slang::syntax::ConfigCellIdentifierSyntax_*,_5UL> topCells;
  Token design;
  not_null<slang::syntax::ExpressionSyntax_*> expr;
  DeclaratorSyntax *decl;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range4;
  ParameterDeclarationBaseSyntax *paramBase;
  Token paramSemi;
  SmallVector<slang::syntax::ParameterDeclarationStatementSyntax_*,_5UL> localparams;
  Token semi1;
  Token name;
  Token config;
  ParserBase *in_stack_fffffffffffff628;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_fffffffffffff630;
  Diagnostic *this_01;
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *this_02;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *this_03;
  undefined6 in_stack_fffffffffffff638;
  TokenKind in_stack_fffffffffffff63e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff640;
  ParserBase *in_stack_fffffffffffff648;
  SourceLocation in_stack_fffffffffffff650;
  SourceLocation in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff660;
  DiagCode in_stack_fffffffffffff664;
  undefined8 in_stack_fffffffffffff668;
  Info *in_stack_fffffffffffff670;
  SyntaxNode *in_stack_fffffffffffff680;
  Parser *in_stack_fffffffffffff688;
  ParserBase *in_stack_fffffffffffff690;
  SourceLocation in_stack_fffffffffffff698;
  DiagCode in_stack_fffffffffffff6a4;
  undefined4 uVar19;
  Info *pIVar20;
  undefined6 uVar21;
  TokenKind in_stack_fffffffffffff6be;
  undefined2 uVar22;
  ParserBase *in_stack_fffffffffffff6c0;
  Parser *in_stack_fffffffffffff6c8;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *topCells_00;
  InstanceConfigRuleSyntax *in_stack_fffffffffffff6e8;
  ConfigLiblistSyntax *in_stack_fffffffffffff6f0;
  ParserBase *in_stack_fffffffffffff6f8;
  undefined8 in_stack_fffffffffffff700;
  Parser *in_stack_fffffffffffff710;
  Parser *in_stack_fffffffffffff760;
  Info local_620 [3];
  Token local_5e8;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *local_5d0;
  SyntaxNode *in_stack_fffffffffffffa50;
  Parser *in_stack_fffffffffffffa58;
  Token in_stack_fffffffffffffa60;
  ConfigLiblistSyntax *local_400;
  SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> local_3b8 [2];
  Token local_378;
  Token local_368;
  Token local_358;
  Token local_348;
  CellConfigRuleSyntax *local_338;
  SourceRange local_330;
  SourceRange local_320;
  undefined4 local_30c;
  string_view local_308;
  ConfigLiblistSyntax *local_2f8;
  ConfigCellIdentifierSyntax *local_2f0;
  Token local_2e8;
  Token local_2d8;
  Token local_2c8;
  DefaultConfigRuleSyntax *local_2b0;
  ConfigLiblistSyntax *local_2a8;
  Token local_2a0;
  SourceRange local_290;
  undefined4 local_27c;
  SourceRange local_278;
  undefined4 local_264;
  Diagnostic *local_260;
  Token local_258;
  SmallVectorBase<slang::syntax::ConfigRuleSyntax_*> local_248 [2];
  ConfigRuleSyntax *local_208;
  Token local_200;
  Token local_1f0;
  SourceLocation local_1e0;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined2 local_1cc;
  undefined4 local_1c6;
  undefined2 local_1c2;
  ConfigCellIdentifierSyntax *local_1c0;
  SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*> local_1b8 [2];
  Token local_178;
  SourceRange local_168;
  undefined4 local_154;
  ExpressionSyntax *local_150;
  DeclaratorSyntax *local_148;
  iterator local_140;
  iterator local_130;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ParameterDeclarationStatementSyntax *local_c8;
  Token local_c0;
  ParameterDeclarationBaseSyntax *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*> local_88 [2];
  Token local_48;
  Token local_38;
  Token local_28;
  Info *pIVar10;
  undefined4 extraout_var_00;
  
  local_28 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff650);
  local_38 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
  local_48 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
  SmallVector<slang::syntax::ParameterDeclarationStatementSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::ParameterDeclarationStatementSyntax_*,_5UL> *)0x8ad7f5);
  while( true ) {
    bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffff640._M_extent_value,
                             in_stack_fffffffffffff63e);
    if (!bVar2) break;
    Token::Token((Token *)in_stack_fffffffffffff630);
    TVar17 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff650);
    local_c0 = TVar17;
    local_b0 = parseParameterDecl(in_stack_fffffffffffffa58,in_stack_fffffffffffffa60,
                                  (Token *)in_stack_fffffffffffffa50);
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               in_stack_fffffffffffff640._M_extent_value,
               (nullptr_t)CONCAT26(in_stack_fffffffffffff63e,in_stack_fffffffffffff638));
    local_118 = local_a8;
    uStack_110 = uStack_a0;
    semi.rawLen._2_2_ = in_stack_fffffffffffff63e;
    semi._0_6_ = in_stack_fffffffffffff638;
    semi.info = (Info *)in_stack_fffffffffffff640._M_extent_value;
    local_c8 = slang::syntax::SyntaxFactory::parameterDeclarationStatement
                         ((SyntaxFactory *)in_stack_fffffffffffff630,
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                          in_stack_fffffffffffff628,(ParameterDeclarationBaseSyntax *)0x8ad913,semi)
    ;
    SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*> *)
               in_stack_fffffffffffff630,
               (ParameterDeclarationStatementSyntax **)in_stack_fffffffffffff628);
    if ((local_b0->super_SyntaxNode).kind == ParameterDeclaration) {
      pPVar5 = slang::syntax::SyntaxNode::as<slang::syntax::ParameterDeclarationSyntax>
                         (&local_b0->super_SyntaxNode);
      local_120 = &pPVar5->declarators;
      iVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                         ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x8ad990);
      local_130 = iVar12;
      iVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                         (in_stack_fffffffffffff630);
      local_140 = iVar12;
      while( true ) {
        bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                          ((self_type *)in_stack_fffffffffffff630,
                           (iterator_base<slang::syntax::DeclaratorSyntax_*> *)
                           in_stack_fffffffffffff628);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        local_148 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                                 *)0x8ada3e);
        if (local_148->initializer != (EqualsValueClauseSyntax *)0x0) {
          not_null<slang::syntax::ExpressionSyntax_*>::
          not_null<slang::not_null<slang::syntax::ExpressionSyntax_*>_&>
                    ((not_null<slang::syntax::ExpressionSyntax_*> *)in_stack_fffffffffffff630,
                     (not_null<slang::syntax::ExpressionSyntax_*> *)in_stack_fffffffffffff628);
          pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                             ((not_null<slang::syntax::ExpressionSyntax_*> *)0x8ada97);
          if ((pEVar6->super_SyntaxNode).kind == ParenthesizedExpression) {
            this_00 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->
                                 ((not_null<slang::syntax::ExpressionSyntax_*> *)0x8adabe)->
                       super_SyntaxNode;
            pPVar7 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedExpressionSyntax>
                               (this_00);
            local_150 = (pPVar7->expression).ptr;
          }
          pEVar6 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                             ((not_null<slang::syntax::ExpressionSyntax_*> *)0x8adb1b);
          SVar1 = (pEVar6->super_SyntaxNode).kind;
          if ((((SVar1 != IntegerLiteralExpression) && (SVar1 != IntegerVectorExpression)) &&
              (SVar1 != NullLiteralExpression)) &&
             (((SVar1 != RealLiteralExpression && (SVar1 != StringLiteralExpression)) &&
              ((SVar1 != TimeLiteralExpression && (SVar1 != UnbasedUnsizedLiteralExpression)))))) {
            local_154 = 0xb0005;
            not_null<slang::syntax::ExpressionSyntax_*>::operator->
                      ((not_null<slang::syntax::ExpressionSyntax_*> *)0x8adbbc);
            SVar14 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff680);
            range.endLoc = in_stack_fffffffffffff658;
            range.startLoc = in_stack_fffffffffffff650;
            local_168 = SVar14;
            ParserBase::addDiag(in_stack_fffffffffffff648,in_stack_fffffffffffff664,range);
          }
        }
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                    *)in_stack_fffffffffffff630);
      }
    }
  }
  local_178 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
  SmallVector<slang::syntax::ConfigCellIdentifierSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::ConfigCellIdentifierSyntax_*,_5UL> *)0x8adc9d);
  while( true ) {
    bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffff640._M_extent_value,
                             in_stack_fffffffffffff63e);
    if (!bVar2) break;
    local_1c0 = parseConfigCellIdentifier(in_stack_fffffffffffff6c8);
    SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*> *)
               in_stack_fffffffffffff630,(ConfigCellIdentifierSyntax **)in_stack_fffffffffffff628);
    bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffff640._M_extent_value,
                             in_stack_fffffffffffff63e);
    if (bVar2) {
      std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
                ((optional<slang::DiagCode> *)in_stack_fffffffffffff630,
                 (DiagCode *)in_stack_fffffffffffff628);
      local_1cc = local_1c2;
      local_1d0 = local_1c6;
      ParserBase::skipToken
                (in_stack_fffffffffffff6f8,
                 (_Optional_base<slang::DiagCode,_true,_true>)
                 SUB86((ulong)in_stack_fffffffffffff700 >> 0x10,0));
    }
  }
  bVar2 = SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>::empty(local_1b8);
  if (bVar2) {
    local_1d4 = 0x410005;
    local_1f0 = ParserBase::peek(in_stack_fffffffffffff628);
    local_1e0 = Token::location(&local_1f0);
    ParserBase::addDiag(in_stack_fffffffffffff690,in_stack_fffffffffffff6a4,
                        in_stack_fffffffffffff698);
  }
  local_200 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
  local_208 = (ConfigRuleSyntax *)0x0;
  SmallVector<slang::syntax::ConfigRuleSyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::ConfigRuleSyntax_*,_5UL> *)0x8adeaa);
  TVar17.info = (Info *)in_stack_fffffffffffff630;
  TVar17._0_8_ = in_stack_fffffffffffff628;
  while( true ) {
    while( true ) {
      while( true ) {
        TVar13 = ParserBase::peek(TVar17._0_8_);
        local_258.kind = TVar13.kind;
        local_258 = TVar13;
        if (local_258.kind != DefaultKeyword) break;
        if (local_208 != (ConfigRuleSyntax *)0x0) {
          local_264 = 0x800005;
          SVar14 = Token::range((Token *)in_stack_fffffffffffff650);
          range_00.endLoc = in_stack_fffffffffffff658;
          range_00.startLoc = in_stack_fffffffffffff650;
          local_278 = SVar14;
          local_260 = ParserBase::addDiag(in_stack_fffffffffffff648,in_stack_fffffffffffff664,
                                          range_00);
          local_27c = 0xa0001;
          SVar14 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff680);
          range_01.endLoc = in_stack_fffffffffffff658;
          range_01.startLoc = in_stack_fffffffffffff650;
          local_290 = SVar14;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff648,in_stack_fffffffffffff664,
                              range_01);
        }
        TVar13 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff650);
        local_2a0 = TVar13;
        local_2a8 = parseConfigLiblist(in_stack_fffffffffffff760);
        local_2c8 = local_258;
        TVar13 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
        defaultKeyword.info = (Info *)in_stack_fffffffffffff650;
        defaultKeyword._0_8_ = in_stack_fffffffffffff648;
        semi_00.rawLen._2_2_ = in_stack_fffffffffffff63e;
        semi_00._0_6_ = in_stack_fffffffffffff638;
        semi_00.info = (Info *)in_stack_fffffffffffff640._M_extent_value;
        local_2d8 = TVar13;
        local_2b0 = slang::syntax::SyntaxFactory::defaultConfigRule
                              ((SyntaxFactory *)TVar17.info,defaultKeyword,TVar17._0_8_,semi_00);
        SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>::push_back
                  ((SmallVectorBase<slang::syntax::ConfigRuleSyntax_*> *)TVar17.info,TVar17._0_8_);
        ppCVar8 = SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>::back(local_248);
        local_208 = *ppCVar8;
      }
      if (local_258.kind != CellKeyword) break;
      TVar13 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff650);
      local_2e8 = TVar13;
      local_2f0 = parseConfigCellIdentifier(in_stack_fffffffffffff6c8);
      bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffff640._M_extent_value,
                               in_stack_fffffffffffff63e);
      if (bVar2) {
        local_2f8 = (ConfigLiblistSyntax *)parseConfigUseClause(in_stack_fffffffffffff710);
      }
      else {
        local_2f8 = parseConfigLiblist(in_stack_fffffffffffff760);
      }
      sVar15 = Token::valueText((Token *)in_stack_fffffffffffff640._M_extent_value);
      local_308 = sVar15;
      bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_308);
      bVar2 = false;
      if (!bVar3) {
        bVar2 = (local_2f8->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind == ConfigLiblist;
      }
      if (bVar2) {
        local_30c = 0xd0005;
        SVar14 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffff680);
        SVar16.endLoc = in_stack_fffffffffffff658;
        SVar16.startLoc = in_stack_fffffffffffff650;
        local_320 = SVar14;
        ParserBase::addDiag(in_stack_fffffffffffff648,in_stack_fffffffffffff664,SVar16);
        this_01 = (Diagnostic *)TVar17.info;
        SVar16 = Token::range((Token *)in_stack_fffffffffffff650);
        SVar14.startLoc._6_2_ = in_stack_fffffffffffff63e;
        SVar14.startLoc._0_6_ = in_stack_fffffffffffff638;
        SVar14.endLoc = (SourceLocation)in_stack_fffffffffffff640._M_extent_value;
        local_330 = SVar16;
        Diagnostic::operator<<(this_01,SVar14);
      }
      local_348 = local_258;
      TVar17 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
      cell.rawLen._2_2_ = in_stack_fffffffffffff63e;
      cell._0_6_ = in_stack_fffffffffffff638;
      cell.info = (Info *)in_stack_fffffffffffff640._M_extent_value;
      semi_01.info = (Info *)in_stack_fffffffffffff658;
      semi_01._0_8_ = in_stack_fffffffffffff650;
      local_358 = TVar17;
      local_338 = slang::syntax::SyntaxFactory::cellConfigRule
                            ((SyntaxFactory *)TVar17.info,cell,TVar17._0_8_,
                             (ConfigRuleClauseSyntax *)0x8ae4ab,semi_01);
      SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>::push_back
                ((SmallVectorBase<slang::syntax::ConfigRuleSyntax_*> *)TVar17.info,TVar17._0_8_);
    }
    if (local_258.kind != InstanceKeyword) break;
    TVar13 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff650);
    local_368 = TVar13;
    TVar13 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
    local_378 = TVar13;
    SmallVector<slang::syntax::ConfigInstanceIdentifierSyntax_*,_5UL>::SmallVector
              ((SmallVector<slang::syntax::ConfigInstanceIdentifierSyntax_*,_5UL> *)0x8ae581);
    while( true ) {
      bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffff640._M_extent_value,
                               in_stack_fffffffffffff63e);
      if (!bVar2) break;
      TVar13 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff650);
      in_stack_fffffffffffff760 = TVar13._0_8_;
      ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
      dot_00.rawLen._2_2_ = in_stack_fffffffffffff63e;
      dot_00._0_6_ = in_stack_fffffffffffff638;
      dot_00.info = (Info *)in_stack_fffffffffffff640._M_extent_value;
      slang::syntax::SyntaxFactory::configInstanceIdentifier
                ((SyntaxFactory *)0x8ae67d,dot_00,TVar17);
      SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::push_back
                ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)TVar17.info,
                 TVar17._0_8_);
    }
    bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffff640._M_extent_value,
                             in_stack_fffffffffffff63e);
    this_02 = (SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *)TVar17.info;
    if (bVar2) {
      local_400 = (ConfigLiblistSyntax *)parseConfigUseClause(in_stack_fffffffffffff710);
      this_02 = (SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *)TVar17.info;
      src = extraout_RDX;
    }
    else {
      local_400 = parseConfigLiblist(in_stack_fffffffffffff760);
      src = extraout_RDX_00;
    }
    SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::copy
              (local_3b8,(EVP_PKEY_CTX *)*in_RDI,src);
    elements._M_ptr._6_2_ = in_stack_fffffffffffff63e;
    elements._M_ptr._0_6_ = in_stack_fffffffffffff638;
    elements._M_extent._M_extent_value = in_stack_fffffffffffff640._M_extent_value;
    in_stack_fffffffffffff710 = extraout_RDX_01;
    slang::syntax::SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax>::SyntaxList
              (this_02,elements);
    TVar17 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
    in_stack_fffffffffffff638 = TVar17.info._0_6_;
    in_stack_fffffffffffff63e = TVar17.info._6_2_;
    instance.info = (Info *)in_stack_fffffffffffff650;
    instance._0_8_ = in_stack_fffffffffffff648;
    topModule_00.info = (Info *)in_stack_fffffffffffff640._M_extent_value;
    topModule_00._0_8_ = TVar17.info;
    semi_02.info = in_stack_fffffffffffff670;
    semi_02.kind = (short)in_stack_fffffffffffff668;
    semi_02._2_1_ = (char)((ulong)in_stack_fffffffffffff668 >> 0x10);
    semi_02.numFlags.raw = (char)((ulong)in_stack_fffffffffffff668 >> 0x18);
    semi_02.rawLen = (int)((ulong)in_stack_fffffffffffff668 >> 0x20);
    in_stack_fffffffffffff6f0 = local_400;
    in_stack_fffffffffffff6e8 =
         slang::syntax::SyntaxFactory::instanceConfigRule
                   (TVar17._0_8_,instance,topModule_00,
                    (SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> *)local_400,
                    (ConfigRuleClauseSyntax *)
                    CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),semi_02);
    SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>::push_back
              (TVar17._0_8_,(ConfigRuleSyntax **)local_400);
    SmallVector<slang::syntax::ConfigInstanceIdentifierSyntax_*,_5UL>::~SmallVector
              ((SmallVector<slang::syntax::ConfigInstanceIdentifierSyntax_*,_5UL> *)0x8ae8cd);
    in_stack_fffffffffffff6f8 = (ParserBase *)TVar17.info;
    TVar17.info = TVar17._0_8_;
    TVar17._0_8_ = local_400;
  }
  config_00 = ParserBase::expect(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6be);
  TVar18 = config_00;
  pNVar9 = parseNamedBlockClause(in_stack_fffffffffffff688);
  TVar13.info = in_stack_fffffffffffff670;
  TVar13.kind = (short)in_stack_fffffffffffff668;
  TVar13._2_1_ = (char)((ulong)in_stack_fffffffffffff668 >> 0x10);
  TVar13.numFlags.raw = (char)((ulong)in_stack_fffffffffffff668 >> 0x18);
  TVar13.rawLen = (int)((ulong)in_stack_fffffffffffff668 >> 0x20);
  checkBlockNames((Parser *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),TVar13,
                  (NamedBlockClauseSyntax *)in_stack_fffffffffffff658);
  topCells_00 = (SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *)(in_RDI + 0x1c);
  elements_00._M_ptr._6_2_ = in_stack_fffffffffffff63e;
  elements_00._M_ptr._0_6_ = in_stack_fffffffffffff638;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffff640._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar17.info,elements_00);
  iVar4 = SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>::copy
                    (local_88,(EVP_PKEY_CTX *)*in_RDI,src_00);
  pIVar10 = (Info *)CONCAT44(extraout_var,iVar4);
  uVar21 = (undefined6)extraout_RDX_02;
  uVar22 = (undefined2)((ulong)extraout_RDX_02 >> 0x30);
  elements_01._M_ptr._6_2_ = in_stack_fffffffffffff63e;
  elements_01._M_ptr._0_6_ = in_stack_fffffffffffff638;
  elements_01._M_extent._M_extent_value = in_stack_fffffffffffff640._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)TVar17.info,
             elements_01);
  iVar4 = SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>::copy
                    (local_1b8,(EVP_PKEY_CTX *)*in_RDI,src_01);
  localparams_00 =
       (SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)
       CONCAT44(extraout_var_00,iVar4);
  elements_02._M_ptr._6_2_ = in_stack_fffffffffffff63e;
  elements_02._M_ptr._0_6_ = in_stack_fffffffffffff638;
  elements_02._M_extent._M_extent_value = in_stack_fffffffffffff640._M_extent_value;
  pIVar20 = extraout_RDX_03;
  local_5d0 = localparams_00;
  slang::syntax::SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *)TVar17.info,elements_02);
  this_03 = (SyntaxList<slang::syntax::ConfigRuleSyntax> *)TVar17.info;
  local_5e8 = local_200;
  iVar4 = SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>::copy
                    (local_248,(EVP_PKEY_CTX *)*in_RDI,src_02);
  elements_03._M_ptr._6_2_ = in_stack_fffffffffffff63e;
  elements_03._M_ptr._0_6_ = in_stack_fffffffffffff638;
  elements_03._M_extent._M_extent_value = in_stack_fffffffffffff640._M_extent_value;
  uVar19 = extraout_var_01;
  slang::syntax::SyntaxList<slang::syntax::ConfigRuleSyntax>::SyntaxList(this_03,elements_03);
  name_00.info = local_620;
  name_00._0_8_ = local_5e8.info;
  semi1_00.rawLen = uVar19;
  semi1_00.kind = (short)iVar4;
  semi1_00._2_1_ = (char)((uint)iVar4 >> 0x10);
  semi1_00.numFlags.raw = (char)((uint)iVar4 >> 0x18);
  semi1_00.info = pIVar20;
  design_00.rawLen._2_2_ = uVar22;
  design_00._0_6_ = uVar21;
  design_00.info = pIVar10;
  semi2_00.info = TVar18.info;
  semi2_00._0_8_ = pNVar9;
  endconfig_00.info = (Info *)in_stack_fffffffffffff6f0;
  endconfig_00._0_8_ = in_stack_fffffffffffff6e8;
  pCVar11 = slang::syntax::SyntaxFactory::configDeclaration
                      ((SyntaxFactory *)local_5e8._0_8_,
                       (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       &stack0xfffffffffffffa40,config_00,name_00,semi1_00,localparams_00,design_00,
                       topCells_00,semi2_00,TVar18._0_8_,endconfig_00,
                       (NamedBlockClauseSyntax *)in_stack_fffffffffffff6f8);
  SmallVector<slang::syntax::ConfigRuleSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::ConfigRuleSyntax_*,_5UL> *)0x8aec00);
  SmallVector<slang::syntax::ConfigCellIdentifierSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::ConfigCellIdentifierSyntax_*,_5UL> *)0x8aec0d);
  SmallVector<slang::syntax::ParameterDeclarationStatementSyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::ParameterDeclarationStatementSyntax_*,_5UL> *)0x8aec1a);
  return pCVar11;
}

Assistant:

ConfigDeclarationSyntax& Parser::parseConfigDeclaration(AttrList attributes) {
    auto config = consume();
    auto name = expect(TokenKind::Identifier);
    auto semi1 = expect(TokenKind::Semicolon);

    SmallVector<ParameterDeclarationStatementSyntax*> localparams;
    while (peek(TokenKind::LocalParamKeyword)) {
        Token paramSemi;
        auto& paramBase = parseParameterDecl(consume(), &paramSemi);
        localparams.push_back(
            &factory.parameterDeclarationStatement(nullptr, paramBase, paramSemi));

        if (paramBase.kind == SyntaxKind::ParameterDeclaration) {
            for (auto decl : paramBase.as<ParameterDeclarationSyntax>().declarators) {
                if (decl->initializer) {
                    auto expr = decl->initializer->expr;
                    if (expr->kind == SyntaxKind::ParenthesizedExpression)
                        expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                    switch (expr->kind) {
                        case SyntaxKind::NullLiteralExpression:
                        case SyntaxKind::StringLiteralExpression:
                        case SyntaxKind::RealLiteralExpression:
                        case SyntaxKind::TimeLiteralExpression:
                        case SyntaxKind::IntegerLiteralExpression:
                        case SyntaxKind::UnbasedUnsizedLiteralExpression:
                        case SyntaxKind::IntegerVectorExpression:
                            break;
                        default:
                            addDiag(diag::ConfigParamLiteral, expr->sourceRange());
                            break;
                    }
                }
            }
        }
    }

    auto design = expect(TokenKind::DesignKeyword);

    SmallVector<ConfigCellIdentifierSyntax*> topCells;
    while (peek(TokenKind::Identifier)) {
        topCells.push_back(&parseConfigCellIdentifier());
        if (peek(TokenKind::Comma))
            skipToken(diag::NoCommaInList);
    }

    if (topCells.empty())
        addDiag(diag::ExpectedIdentifier, peek().location());

    auto semi2 = expect(TokenKind::Semicolon);

    const ConfigRuleSyntax* defaultRule = nullptr;
    SmallVector<ConfigRuleSyntax*> rules;
    while (true) {
        auto token = peek();
        if (token.kind == TokenKind::DefaultKeyword) {
            if (defaultRule) {
                auto& diag = addDiag(diag::MultipleDefaultRules, token.range());
                diag.addNote(diag::NotePreviousDefinition, defaultRule->sourceRange());
            }

            consume();
            auto& liblist = parseConfigLiblist();
            rules.push_back(
                &factory.defaultConfigRule(token, liblist, expect(TokenKind::Semicolon)));
            defaultRule = rules.back();
        }
        else if (token.kind == TokenKind::CellKeyword) {
            consume();
            auto& cellName = parseConfigCellIdentifier();

            ConfigRuleClauseSyntax* rule;
            if (peek(TokenKind::UseKeyword))
                rule = &parseConfigUseClause();
            else
                rule = &parseConfigLiblist();

            if (!cellName.library.valueText().empty() && rule->kind == SyntaxKind::ConfigLiblist) {
                addDiag(diag::ConfigSpecificCellLiblist, rule->sourceRange())
                    << cellName.library.range();
            }

            rules.push_back(
                &factory.cellConfigRule(token, cellName, *rule, expect(TokenKind::Semicolon)));
        }
        else if (token.kind == TokenKind::InstanceKeyword) {
            consume();
            auto topModule = expect(TokenKind::Identifier);

            SmallVector<ConfigInstanceIdentifierSyntax*> instanceNames;
            while (peek(TokenKind::Dot)) {
                auto dot = consume();
                instanceNames.push_back(
                    &factory.configInstanceIdentifier(dot, expect(TokenKind::Identifier)));
            }

            ConfigRuleClauseSyntax* rule;
            if (peek(TokenKind::UseKeyword))
                rule = &parseConfigUseClause();
            else
                rule = &parseConfigLiblist();

            rules.push_back(&factory.instanceConfigRule(token, topModule, instanceNames.copy(alloc),
                                                        *rule, expect(TokenKind::Semicolon)));
        }
        else {
            break;
        }
    }

    auto endconfig = expect(TokenKind::EndConfigKeyword);
    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.configDeclaration(attributes, config, name, semi1, localparams.copy(alloc),
                                     design, topCells.copy(alloc), semi2, rules.copy(alloc),
                                     endconfig, blockName);
}